

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_abstracttxin.cpp
# Opt level: O0

void __thiscall AbstractTxIn_WitnessStack_Test::TestBody(AbstractTxIn_WitnessStack_Test *this)

{
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_4d8;
  AbstractTxIn local_4c0;
  allocator local_429;
  string local_428;
  ByteData local_408;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_3f0;
  AbstractTxIn local_3d8;
  allocator local_341;
  string local_340;
  ByteData local_320;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_308;
  AbstractTxIn local_2f0;
  allocator local_259;
  string local_258;
  ByteData local_238;
  allocator local_219;
  string local_218;
  ByteData local_1f8;
  allocator local_1d9;
  string local_1d8;
  ByteData local_1b8;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_1a0;
  AbstractTxIn local_188;
  undefined1 local_f8 [8];
  anon_class_16_2_6e1414ad removeWitnessStack;
  anon_class_16_2_6e1414ad setWitnessStack;
  anon_class_16_2_6e1414ad addWitnessStack;
  anon_class_1_0_00000001 checkWitnessStack;
  undefined1 local_b8 [8];
  AbstractTxIn actual;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> expect_stack;
  AbstractTxIn_WitnessStack_Test *this_local;
  
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
             &actual.script_witness_.witness_stack_.
              super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::AbstractTxIn::AbstractTxIn
            ((AbstractTxIn *)local_b8,&expect_txid,1,0xffffffff,&expect_unlocking_script);
  local_f8 = (undefined1  [8])local_b8;
  removeWitnessStack.actual =
       (AbstractTxIn *)
       &actual.script_witness_.witness_stack_.
        super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage;
  removeWitnessStack.expect_stack =
       (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)local_f8;
  setWitnessStack.actual = removeWitnessStack.actual;
  setWitnessStack.expect_stack =
       (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)local_f8;
  addWitnessStack.actual = removeWitnessStack.actual;
  cfd::core::AbstractTxIn::AbstractTxIn(&local_188,(AbstractTxIn *)local_f8);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector
            (&local_1a0,
             (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
             &actual.script_witness_.witness_stack_.
              super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)((long)&addWitnessStack.expect_stack + 3),&local_188,
             &local_1a0);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_1a0);
  cfd::core::AbstractTxIn::~AbstractTxIn(&local_188);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1d8,"1111",&local_1d9);
  cfd::core::ByteData::ByteData(&local_1b8,&local_1d8);
  TestBody::anon_class_16_2_6e1414ad::operator()
            ((anon_class_16_2_6e1414ad *)&setWitnessStack.expect_stack,&local_1b8);
  cfd::core::ByteData::~ByteData(&local_1b8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_218,"aaaa",&local_219);
  cfd::core::ByteData::ByteData(&local_1f8,&local_218);
  TestBody::anon_class_16_2_6e1414ad::operator()
            ((anon_class_16_2_6e1414ad *)&setWitnessStack.expect_stack,&local_1f8);
  cfd::core::ByteData::~ByteData(&local_1f8);
  std::__cxx11::string::~string((string *)&local_218);
  std::allocator<char>::~allocator((allocator<char> *)&local_219);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_258,"3333",&local_259);
  cfd::core::ByteData::ByteData(&local_238,&local_258);
  TestBody::anon_class_16_2_6e1414ad::operator()
            ((anon_class_16_2_6e1414ad *)&setWitnessStack.expect_stack,&local_238);
  cfd::core::ByteData::~ByteData(&local_238);
  std::__cxx11::string::~string((string *)&local_258);
  std::allocator<char>::~allocator((allocator<char> *)&local_259);
  cfd::core::AbstractTxIn::AbstractTxIn(&local_2f0,(AbstractTxIn *)local_b8);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector
            (&local_308,
             (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
             &actual.script_witness_.witness_stack_.
              super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)((long)&addWitnessStack.expect_stack + 3),&local_2f0,
             &local_308);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_308);
  cfd::core::AbstractTxIn::~AbstractTxIn(&local_2f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_340,"2222",&local_341);
  cfd::core::ByteData::ByteData(&local_320,&local_340);
  TestBody::anon_class_16_2_6e1414ad::operator()
            ((anon_class_16_2_6e1414ad *)&removeWitnessStack.expect_stack,1,&local_320);
  cfd::core::ByteData::~ByteData(&local_320);
  std::__cxx11::string::~string((string *)&local_340);
  std::allocator<char>::~allocator((allocator<char> *)&local_341);
  cfd::core::AbstractTxIn::AbstractTxIn(&local_3d8,(AbstractTxIn *)local_b8);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector
            (&local_3f0,
             (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
             &actual.script_witness_.witness_stack_.
              super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)((long)&addWitnessStack.expect_stack + 3),&local_3d8,
             &local_3f0);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_3f0);
  cfd::core::AbstractTxIn::~AbstractTxIn(&local_3d8);
  TestBody::anon_class_16_2_6e1414ad::operator()((anon_class_16_2_6e1414ad *)local_f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_428,"aaaa",&local_429);
  cfd::core::ByteData::ByteData(&local_408,&local_428);
  TestBody::anon_class_16_2_6e1414ad::operator()
            ((anon_class_16_2_6e1414ad *)&setWitnessStack.expect_stack,&local_408);
  cfd::core::ByteData::~ByteData(&local_408);
  std::__cxx11::string::~string((string *)&local_428);
  std::allocator<char>::~allocator((allocator<char> *)&local_429);
  cfd::core::AbstractTxIn::AbstractTxIn(&local_4c0,(AbstractTxIn *)local_b8);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector
            (&local_4d8,
             (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
             &actual.script_witness_.witness_stack_.
              super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)((long)&addWitnessStack.expect_stack + 3),&local_4c0,
             &local_4d8);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_4d8);
  cfd::core::AbstractTxIn::~AbstractTxIn(&local_4c0);
  cfd::core::AbstractTxIn::~AbstractTxIn((AbstractTxIn *)local_b8);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
             &actual.script_witness_.witness_stack_.
              super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

TEST(AbstractTxIn, WitnessStack) {
  std::vector<ByteData> expect_stack;
  AbstractTxIn actual = AbstractTxIn(expect_txid, expect_index, expect_sequence,
                                     expect_unlocking_script);

  const auto checkWitnessStack =
      [](AbstractTxIn actual, std::vector<ByteData> expect_stack) -> void {
        EXPECT_STREQ(expect_txid.GetHex().c_str(),
            actual.GetTxid().GetHex().c_str());
        EXPECT_EQ(expect_index, actual.GetVout());
        EXPECT_STREQ(expect_txid.GetHex().c_str(),
            actual.GetOutPoint().GetTxid().GetHex().c_str());
        EXPECT_EQ(expect_index, actual.GetOutPoint().GetVout());
        EXPECT_EQ(expect_sequence, actual.GetSequence());
        EXPECT_STREQ(expect_script_hex.c_str(),
            actual.GetUnlockingScript().GetScript().GetHex().c_str());

        EXPECT_EQ(expect_stack.size(), actual.GetScriptWitnessStackNum());
        std::vector<ByteData> actual_stack = actual.GetScriptWitness().GetWitness();
        for (size_t i = 0; i < actual.GetScriptWitnessStackNum(); ++i) {
          EXPECT_TRUE(expect_stack[i].Equals(actual_stack[i]));
        }
      };

  const auto addWitnessStack = [&actual, &expect_stack](ByteData data) -> void {
    actual.AddScriptWitnessStack(data);
    expect_stack.push_back(data);
  };

  const auto setWitnessStack =
      [&actual, &expect_stack](uint32_t index, ByteData data) -> void {
        ASSERT_NO_THROW(actual.SetScriptWitnessStack(index, data));
        expect_stack[index] = data;
      };

  const auto removeWitnessStack = [&actual, &expect_stack]() -> void {
    actual.RemoveScriptWitnessStackAll();
    expect_stack.clear();
  };

  checkWitnessStack(actual, expect_stack);
  addWitnessStack(ByteData("1111"));
  addWitnessStack(ByteData("aaaa"));
  addWitnessStack(ByteData("3333"));
  checkWitnessStack(actual, expect_stack);
  setWitnessStack(1, ByteData("2222"));
  checkWitnessStack(actual, expect_stack);
  removeWitnessStack();
  addWitnessStack(ByteData("aaaa"));
  checkWitnessStack(actual, expect_stack);
}